

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O0

size_t __thiscall
Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
Check(SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
      *this,bool checkCount)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  Recycler *pRVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *in_R8;
  undefined8 *in_FS_OFFSET;
  size_t smallHeapBlockCount;
  bool checkCount_local;
  SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  sVar3 = HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::Check
                    (&this->
                      super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                     ,false);
  if (this->partialHeapBlockList != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
    if ((pRVar4->inPartialCollectMode & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2de,
                         "(partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  sVar5 = HeapInfo::Check<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                    ((HeapInfo *)0x0,false,SUB81(this->partialHeapBlockList,0),
                     (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,in_R8);
  if (this->partialSweptHeapBlockList !=
      (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
    if ((pRVar4->inPartialCollectMode & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2e2,
                         "(partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  sVar6 = HeapInfo::Check<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                    ((HeapInfo *)0x0,false,SUB81(this->partialSweptHeapBlockList,0),
                     (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,in_R8);
  uVar7 = sVar6 + sVar5 + sVar3;
  if ((checkCount) &&
     ((this->super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>).
      super_HeapBucket.heapBlockCount != uVar7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x2e6,"(!checkCount || this->heapBlockCount == smallHeapBlockCount)",
                       "!checkCount || this->heapBlockCount == smallHeapBlockCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return uVar7;
}

Assistant:

size_t
SmallNormalHeapBucketBase<TBlockType>::Check(bool checkCount)
{
    size_t smallHeapBlockCount = __super::Check(false);
    Assert(partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    smallHeapBlockCount += HeapInfo::Check(false, false, this->partialHeapBlockList);

#if ENABLE_CONCURRENT_GC
    Assert(partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    smallHeapBlockCount += HeapInfo::Check(false, false, this->partialSweptHeapBlockList);
#endif

    Assert(!checkCount || this->heapBlockCount == smallHeapBlockCount);
    return smallHeapBlockCount;
}